

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::GetKnightMoves<true>(Node *this,Color color,int from,int depth)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint to;
  long lVar6;
  ulong uVar7;
  int score;
  uint cap;
  ulong uVar8;
  Move *this_00;
  int local_48;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x685,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x686,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  uVar8 = (ulong)(uint)from;
  pbVar2 = (byte *)(&_board)[uVar8];
  if (pbVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x687,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if (color + 4 != (uint)*pbVar2) {
    __assert_fail("_board[from]->type == (color|Knight)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x688,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((uint)pbVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x689,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  iVar4 = GetPinDir(this,color,from);
  if (iVar4 == 0) {
    local_48 = 0;
    if (depth == 0) {
      local_48 = GetDiscoverDir(this,color,from);
    }
    if (*(ulong *)(_knightMoves + uVar8 * 8) != 0) {
      uVar7 = *(ulong *)(_knightMoves + uVar8 * 8);
      do {
        if ((uVar7 & 0xff) == 0) {
          __assert_fail("mvs & 0xFF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x695,
                        "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                       );
        }
        to = (int)(uVar7 & 0xff) - 1;
        if ((to & 0xffffff88) != 0) {
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x697,
                        "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                       );
        }
        if (to == from) {
          __assert_fail("to != from",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x698,
                        "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                       );
        }
        uVar5 = (ulong)to;
        bVar1 = *(byte *)(&_board)[uVar5];
        cap = (uint)bVar1;
        if ((bVar1 == 0) && ((byte *)(&_board)[uVar5] != _EMPTY)) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x69a,
                        "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                       );
        }
        if (bVar1 == 0) {
          if (depth == 0) {
            if (((&_KING)[!color][1] & 0x88) != 0) {
              __assert_fail("IS_SQUARE(from)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10d,"int clunk::IsKnightMove(const int, const int)");
            }
            if (_knightDir[uVar5 + (ulong)(byte)(&_KING)[!color][1] * 0x80] != '\0' || local_48 != 0
               ) {
              iVar4 = this->moveCount;
              lVar6 = (long)iVar4;
              if (lVar6 < 0) goto LAB_0012fa35;
              if (0x7e < iVar4) goto LAB_0012fa54;
              score = (*(int *)(_SQR + uVar5 * 4) - *(int *)(_SQR + uVar8 * 4)) + 0x14;
              this->moveCount = iVar4 + 1;
              cap = 0;
              goto LAB_0012f95a;
            }
          }
        }
        else if ((Color)(bVar1 & 1) != color) {
          if (9 < bVar1 - 2) {
            __assert_fail("!pc || IS_CAP(pc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x114,"int clunk::ValueOf(const int)");
          }
          iVar4 = this->moveCount;
          lVar6 = (long)iVar4;
          if (lVar6 < 0) {
LAB_0012fa35:
            __assert_fail("moveCount >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x60d,
                          "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                         );
          }
          if (0x7e < iVar4) {
LAB_0012fa54:
            __assert_fail("(moveCount + 1) < MaxMoves",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x60e,
                          "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                         );
          }
          score = ((*(int *)(_VALUE_OF + (ulong)bVar1 * 4) + *(int *)(_SQR + uVar5 * 4)) -
                  *(int *)(_SQR + uVar8 * 4)) + -0x20;
          this->moveCount = iVar4 + 1;
LAB_0012f95a:
          this_00 = this->moves + lVar6;
          Move::Set(this_00,KnightMove,from,to,cap,0,score);
          iVar4 = 0;
          if (this_00->bits == this->killer[1].bits) {
            iVar4 = 0x32;
          }
          if (this_00->bits == this->killer[0].bits) {
            iVar4 = 0x32;
          }
          Move::IncScore(this_00,iVar4);
        }
        bVar3 = 0xff < uVar7;
        uVar7 = uVar7 >> 8;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void GetKnightMoves(const Color color, const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Knight));
    assert(_board[from]->sqr == from);
    if (GetPinDir(color, from)) {
      return;
    }

    int kdir = 0;
    if (qsearch && !depth) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _knightMoves[from]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(IS_SQUARE(to));
      assert(to != from);
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if (qsearch) {
          if (!depth && (kdir | IsKnightMove(_KING[!color]->sqr, to))) {
            score = (_SQR[to] - _SQR[from] + 20);
            AddMove(KnightMove, from, to, score);
          }
        }
        else {
          score = (_SQR[to] - _SQR[from]);
          AddMove(KnightMove, from, to, score);
        }
      }
      else if (COLOR(cap) != color) {
        score = (ValueOf(cap) + _SQR[to] - _SQR[from] - (8 * KnightMove));
        AddMove(KnightMove, from, to, score, cap);
      }
    }
  }